

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_execSequenceEnd
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *prefixStart,
                 BYTE *virtualStart,BYTE *dictEnd)

{
  ulong uVar1;
  BYTE *pBVar2;
  ulong uVar3;
  BYTE *op_00;
  BYTE *ip;
  long lVar4;
  
  uVar1 = sequence.matchLength + sequence.litLength;
  uVar3 = 0xffffffffffffffba;
  if (uVar1 <= (ulong)((long)oend - (long)op)) {
    pBVar2 = *litPtr;
    uVar3 = 0xffffffffffffffec;
    if (sequence.litLength <= (ulong)((long)litLimit - (long)pBVar2)) {
      if ((long)uVar1 < 1) {
        __assert_fail("op < op + sequenceLength",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa7f6,
                      "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      if ((long)uVar1 <= (long)sequence.litLength) {
        __assert_fail("oLitEnd < op + sequenceLength",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,42999,
                      "size_t ZSTD_execSequenceEnd(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      op_00 = op + sequence.litLength;
      ip = op_00 + -sequence.offset;
      ZSTD_safecopy(op,oend + -0x20,pBVar2,sequence.litLength,ZSTD_no_overlap);
      *litPtr = pBVar2 + sequence.litLength;
      if ((ulong)((long)op_00 - (long)prefixStart) < sequence.offset) {
        if ((ulong)((long)op_00 - (long)virtualStart) < sequence.offset) {
          return 0xffffffffffffffec;
        }
        lVar4 = (long)ip - (long)prefixStart;
        pBVar2 = dictEnd + lVar4;
        if (pBVar2 + sequence.matchLength <= dictEnd) {
          memmove(op_00,pBVar2,sequence.matchLength);
          return uVar1;
        }
        memmove(op_00,pBVar2,-lVar4);
        op_00 = op_00 + -lVar4;
        sequence.matchLength = sequence.matchLength + lVar4;
        ip = prefixStart;
      }
      ZSTD_safecopy(op_00,oend + -0x20,ip,sequence.matchLength,ZSTD_overlap_src_before_dst);
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceEnd(BYTE* op,
    BYTE* const oend, seq_t sequence,
    const BYTE** litPtr, const BYTE* const litLimit,
    const BYTE* const prefixStart, const BYTE* const virtualStart, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;
    BYTE* const oend_w = oend - WILDCOPY_OVERLENGTH;

    /* bounds checks : careful of address space overflow in 32-bit mode */
    RETURN_ERROR_IF(sequenceLength > (size_t)(oend - op), dstSize_tooSmall, "last match must fit within dstBuffer");
    RETURN_ERROR_IF(sequence.litLength > (size_t)(litLimit - *litPtr), corruption_detected, "try to read beyond literal buffer");
    assert(op < op + sequenceLength);
    assert(oLitEnd < op + sequenceLength);

    /* copy literals */
    ZSTD_safecopy(op, oend_w, *litPtr, sequence.litLength, ZSTD_no_overlap);
    op = oLitEnd;
    *litPtr = iLitEnd;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - prefixStart)) {
        /* offset beyond prefix */
        RETURN_ERROR_IF(sequence.offset > (size_t)(oLitEnd - virtualStart), corruption_detected, "");
        match = dictEnd - (prefixStart - match);
        if (match + sequence.matchLength <= dictEnd) {
            ZSTD_memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
        ZSTD_memmove(oLitEnd, match, length1);
        op = oLitEnd + length1;
        sequence.matchLength -= length1;
        match = prefixStart;
        }
    }
    ZSTD_safecopy(op, oend_w, match, sequence.matchLength, ZSTD_overlap_src_before_dst);
    return sequenceLength;
}